

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_avx2.c
# Opt level: O0

void compute_stats_highbd_win5_opt_avx2
               (uint8_t *dgd8,uint8_t *src8,int h_start,int h_end,int v_start,int v_end,
               int dgd_stride,int src_stride,int64_t *M,int64_t *H,aom_bit_depth_t bit_depth)

{
  int iVar1;
  long lVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  void *a;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  undefined4 in_stack_0000001c;
  int64_t *H_int_;
  int64_t *H_;
  int32_t idx0;
  int64_t avg_square_sum;
  uint8_t bit_depth_divider;
  int vert_end;
  __m256i shuffle;
  uint16_t *dgd_win;
  int32_t sumX;
  int32_t sumY [5] [5];
  int64_t H_int64 [25] [40];
  int64_t M_int64 [5] [5];
  uint16_t avg;
  uint16_t *dgd;
  uint16_t *src;
  int wiener_halfwin;
  int wiener_win2;
  int pixel_count;
  int wiener_win;
  int n;
  int m;
  int l;
  int k;
  int j;
  int i;
  int64_t (*in_stack_ffffffffffffde80) [40];
  int local_216c;
  byte local_2145;
  int32_t local_2110 [22];
  __m256i *in_stack_ffffffffffffdf48;
  int in_stack_ffffffffffffdf54;
  int in_stack_ffffffffffffdf58;
  int in_stack_ffffffffffffdf5c;
  uint16_t *in_stack_ffffffffffffdf60;
  uint16_t *in_stack_ffffffffffffdf68;
  long local_160 [25];
  uint16_t local_92;
  uint16_t *local_90;
  long local_88;
  undefined4 local_80;
  undefined4 local_7c;
  int local_78;
  undefined4 local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  
  local_74 = 5;
  local_78 = (in_ECX - in_EDX) * (in_R9D - in_R8D);
  local_7c = 0x19;
  local_80 = 2;
  local_88 = in_RSI << 1;
  local_90 = (uint16_t *)(in_RDI << 1);
  local_58 = in_R9D;
  local_54 = in_R8D;
  local_92 = find_average_highbd(local_90,in_EDX,in_ECX,in_R8D,in_R9D,in_stack_00000008);
  memset(local_160,0,200);
  memset(&stack0xffffffffffffdf60,0,8000);
  a = (void *)0x0;
  memset(local_2110,0,100);
  yy_loadu_256((__m256i *)"",a);
  for (local_60 = local_54; local_60 < local_58; local_60 = local_60 + 0x40) {
    if (local_58 - local_60 < 0x41) {
      local_216c = local_58 - local_60;
    }
    else {
      local_216c = 0x40;
    }
    local_216c = local_216c + local_60;
    for (local_5c = local_60; local_5c < local_216c; local_5c = local_5c + 1) {
      acc_stat_highbd_win5_one_line_avx2
                (in_stack_ffffffffffffdf68,in_stack_ffffffffffffdf60,in_stack_ffffffffffffdf5c,
                 in_stack_ffffffffffffdf58,in_stack_ffffffffffffdf54,in_stack_ffffffffffffdf48,
                 local_2110,(int32_t (*) [5])local_160,(int64_t (*) [5])&stack0xffffffffffffdf60,
                 in_stack_ffffffffffffde80);
    }
  }
  local_2145 = 1;
  if ((int)H == 0xc) {
    local_2145 = 0x10;
  }
  else if ((int)H == 10) {
    local_2145 = 4;
  }
  lVar2 = (ulong)local_92 * (ulong)local_92 * (long)local_78;
  for (local_64 = 0; local_64 < 5; local_64 = local_64 + 1) {
    for (local_68 = 0; local_68 < 5; local_68 = local_68 + 1) {
      iVar1 = local_68 * 5 + local_64;
      *(long *)(CONCAT44(in_stack_0000001c,src_stride) + (long)iVar1 * 8) =
           (long)(local_160[(long)local_64 * 5 + (long)local_68] +
                 (lVar2 - (ulong)local_92 * (long)local_2110[(long)local_64 * 5 + (long)local_68]))
           / (long)(ulong)local_2145;
      for (local_6c = 0; local_6c < 5; local_6c = local_6c + 1) {
        for (local_70 = 0; local_70 < 5; local_70 = local_70 + 1) {
          M[(long)(iVar1 * 0x19) + (long)(local_6c * 5 + local_70)] =
               (long)(*(long *)(&stack0xffffffffffffdf60 +
                               (long)(local_70 * 8 + local_6c) * 8 + (long)iVar1 * 0x140) +
                     (lVar2 - (ulong)local_92 *
                              (long)(local_2110[(long)local_64 * 5 + (long)local_68] +
                                    local_2110[(long)local_70 * 5 + (long)local_6c]))) /
               (long)(ulong)local_2145;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void compute_stats_highbd_win5_opt_avx2(
    const uint8_t *dgd8, const uint8_t *src8, int h_start, int h_end,
    int v_start, int v_end, int dgd_stride, int src_stride, int64_t *M,
    int64_t *H, aom_bit_depth_t bit_depth) {
  int i, j, k, l, m, n;
  const int wiener_win = WIENER_WIN_CHROMA;
  const int pixel_count = (h_end - h_start) * (v_end - v_start);
  const int wiener_win2 = wiener_win * wiener_win;
  const int wiener_halfwin = (wiener_win >> 1);
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *dgd = CONVERT_TO_SHORTPTR(dgd8);
  const uint16_t avg =
      find_average_highbd(dgd, h_start, h_end, v_start, v_end, dgd_stride);

  int64_t M_int64[WIENER_WIN_CHROMA][WIENER_WIN_CHROMA] = { { 0 } };
  DECLARE_ALIGNED(
      32, int64_t,
      H_int64[WIENER_WIN2_CHROMA][WIENER_WIN_CHROMA * 8]) = { { 0 } };
  int32_t sumY[WIENER_WIN_CHROMA][WIENER_WIN_CHROMA] = { { 0 } };
  int32_t sumX = 0;
  const uint16_t *dgd_win = dgd - wiener_halfwin * dgd_stride - wiener_halfwin;

  const __m256i shuffle = yy_loadu_256(g_shuffle_stats_highbd_data);
  for (j = v_start; j < v_end; j += 64) {
    const int vert_end = AOMMIN(64, v_end - j) + j;
    for (i = j; i < vert_end; i++) {
      acc_stat_highbd_win5_one_line_avx2(
          dgd_win + i * dgd_stride, src + i * src_stride, h_start, h_end,
          dgd_stride, &shuffle, &sumX, sumY, M_int64, H_int64);
    }
  }

  uint8_t bit_depth_divider = 1;
  if (bit_depth == AOM_BITS_12)
    bit_depth_divider = 16;
  else if (bit_depth == AOM_BITS_10)
    bit_depth_divider = 4;

  const int64_t avg_square_sum = (int64_t)avg * (int64_t)avg * pixel_count;
  for (k = 0; k < wiener_win; k++) {
    for (l = 0; l < wiener_win; l++) {
      const int32_t idx0 = l * wiener_win + k;
      M[idx0] = (M_int64[k][l] +
                 (avg_square_sum - (int64_t)avg * (sumX + sumY[k][l]))) /
                bit_depth_divider;
      int64_t *H_ = H + idx0 * wiener_win2;
      int64_t *H_int_ = &H_int64[idx0][0];
      for (m = 0; m < wiener_win; m++) {
        for (n = 0; n < wiener_win; n++) {
          H_[m * wiener_win + n] =
              (H_int_[n * 8 + m] +
               (avg_square_sum - (int64_t)avg * (sumY[k][l] + sumY[n][m]))) /
              bit_depth_divider;
        }
      }
    }
  }
}